

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

bool __thiscall
cmGeneratorTarget::ComputeOutputDir
          (cmGeneratorTarget *this,string *config,ArtifactType artifact,string *out)

{
  size_type sVar1;
  cmGlobalGenerator *pcVar2;
  cmMakefile *pcVar3;
  bool bVar4;
  int iVar5;
  TargetType TVar6;
  char *pcVar7;
  cmValue cVar8;
  string *in_base;
  string suffix;
  string conf;
  string targetTypeName;
  string configUpper;
  string configProp;
  string propertyName;
  cmAlphaNum local_188;
  undefined1 local_158 [48];
  string local_128;
  char *local_108;
  size_t local_100;
  string local_e8;
  string local_c8;
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  
  std::__cxx11::string::string((string *)&local_128,(string *)config);
  pcVar7 = GetOutputTargetType(this,artifact);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_108,pcVar7,(allocator<char> *)&local_188);
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  local_a8._M_string_length = 0;
  local_a8.field_2._M_local_buf[0] = '\0';
  if (local_100 != 0) {
    local_188.View_._M_len = local_100;
    local_188.View_._M_str = local_108;
    local_158._0_8_ = &DAT_00000011;
    local_158._8_8_ = "_OUTPUT_DIRECTORY";
    cmStrCat<>(&local_e8,&local_188,(cmAlphaNum *)local_158);
    std::__cxx11::string::operator=((string *)&local_a8,(string *)&local_e8);
    std::__cxx11::string::~string((string *)&local_e8);
  }
  cmsys::SystemTools::UpperCase(&local_e8,&local_128);
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  local_c8._M_string_length = 0;
  local_c8.field_2._M_local_buf[0] = '\0';
  if (local_100 != 0) {
    local_188.View_._M_len = local_100;
    local_188.View_._M_str = local_108;
    local_158._0_8_ = (pointer)0x12;
    local_158._8_8_ = "_OUTPUT_DIRECTORY_";
    cmStrCat<std::__cxx11::string>(&local_48,&local_188,(cmAlphaNum *)local_158,&local_e8);
    std::__cxx11::string::operator=((string *)&local_c8,(string *)&local_48);
    std::__cxx11::string::~string((string *)&local_48);
  }
  cVar8 = GetProperty(this,&local_c8);
  if (cVar8.Value == (string *)0x0) {
    cVar8 = GetProperty(this,&local_a8);
    if (cVar8.Value == (string *)0x0) {
      TVar6 = GetType(this);
      if (TVar6 == EXECUTABLE) {
        pcVar3 = this->Makefile;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_188,"EXECUTABLE_OUTPUT_PATH",(allocator<char> *)local_158);
        cmMakefile::GetSafeDefinition(pcVar3,(string *)&local_188);
        std::__cxx11::string::_M_assign((string *)out);
      }
      else {
        TVar6 = GetType(this);
        if (((TVar6 != STATIC_LIBRARY) && (TVar6 = GetType(this), TVar6 != SHARED_LIBRARY)) &&
           (TVar6 = GetType(this), TVar6 != MODULE_LIBRARY)) goto LAB_00350a26;
        pcVar3 = this->Makefile;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_188,"LIBRARY_OUTPUT_PATH",(allocator<char> *)local_158);
        cmMakefile::GetSafeDefinition(pcVar3,(string *)&local_188);
        std::__cxx11::string::_M_assign((string *)out);
      }
      std::__cxx11::string::~string((string *)&local_188);
      goto LAB_00350a26;
    }
    std::__cxx11::string::string((string *)&local_88,(string *)cVar8.Value);
    local_158._0_8_ = local_158 + 0x10;
    local_158._8_8_ = (char *)0x0;
    local_158[0x10] = '\0';
    cmGeneratorExpression::Evaluate
              ((string *)&local_188,&local_88,this->LocalGenerator,config,this,
               (cmGeneratorExpressionDAGChecker *)0x0,(cmGeneratorTarget *)0x0,(string *)local_158);
    std::__cxx11::string::operator=((string *)out,(string *)&local_188);
    std::__cxx11::string::~string((string *)&local_188);
    std::__cxx11::string::~string((string *)local_158);
    std::__cxx11::string::~string((string *)&local_88);
    bVar4 = std::operator!=(out,cVar8.Value);
    if (!bVar4) goto LAB_00350a26;
  }
  else {
    std::__cxx11::string::string((string *)&local_68,(string *)cVar8.Value);
    local_158._0_8_ = local_158 + 0x10;
    local_158._8_8_ = (char *)0x0;
    local_158[0x10] = '\0';
    cmGeneratorExpression::Evaluate
              ((string *)&local_188,&local_68,this->LocalGenerator,config,this,
               (cmGeneratorExpressionDAGChecker *)0x0,(cmGeneratorTarget *)0x0,(string *)local_158);
    std::__cxx11::string::operator=((string *)out,(string *)&local_188);
    std::__cxx11::string::~string((string *)&local_188);
    std::__cxx11::string::~string((string *)local_158);
    std::__cxx11::string::~string((string *)&local_68);
  }
  local_128._M_string_length = 0;
  *local_128._M_dataplus._M_p = '\0';
LAB_00350a26:
  sVar1 = out->_M_string_length;
  if (sVar1 == 0) {
    std::__cxx11::string::assign((char *)out);
  }
  in_base = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(this->LocalGenerator);
  cmsys::SystemTools::CollapseFullPath((string *)&local_188,out,in_base);
  std::__cxx11::string::operator=((string *)out,(string *)&local_188);
  std::__cxx11::string::~string((string *)&local_188);
  if (local_128._M_string_length != 0) {
    iVar5 = (*this->GlobalGenerator->_vptr_cmGlobalGenerator[0x2f])
                      (this->GlobalGenerator,this->Makefile);
    pcVar7 = "${EFFECTIVE_PLATFORM_NAME}";
    if ((char)iVar5 == '\0') {
      pcVar7 = "";
    }
    if (sVar1 != 0) {
      pcVar7 = "";
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_188,pcVar7,(allocator<char> *)local_158);
    pcVar2 = this->LocalGenerator->GlobalGenerator;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_158,"/",(allocator<char> *)&local_48);
    (*pcVar2->_vptr_cmGlobalGenerator[0x18])(pcVar2,local_158,&local_128,&local_188,out);
    std::__cxx11::string::~string((string *)local_158);
    std::__cxx11::string::~string((string *)&local_188);
  }
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)&local_128);
  return sVar1 == 0;
}

Assistant:

bool cmGeneratorTarget::ComputeOutputDir(const std::string& config,
                                         cmStateEnums::ArtifactType artifact,
                                         std::string& out) const
{
  bool usesDefaultOutputDir = false;
  std::string conf = config;

  // Look for a target property defining the target output directory
  // based on the target type.
  std::string targetTypeName = this->GetOutputTargetType(artifact);
  std::string propertyName;
  if (!targetTypeName.empty()) {
    propertyName = cmStrCat(targetTypeName, "_OUTPUT_DIRECTORY");
  }

  // Check for a per-configuration output directory target property.
  std::string configUpper = cmSystemTools::UpperCase(conf);
  std::string configProp;
  if (!targetTypeName.empty()) {
    configProp = cmStrCat(targetTypeName, "_OUTPUT_DIRECTORY_", configUpper);
  }

  // Select an output directory.
  if (cmValue config_outdir = this->GetProperty(configProp)) {
    // Use the user-specified per-configuration output directory.
    out = cmGeneratorExpression::Evaluate(*config_outdir, this->LocalGenerator,
                                          config, this);

    // Skip per-configuration subdirectory.
    conf.clear();
  } else if (cmValue outdir = this->GetProperty(propertyName)) {
    // Use the user-specified output directory.
    out = cmGeneratorExpression::Evaluate(*outdir, this->LocalGenerator,
                                          config, this);
    // Skip per-configuration subdirectory if the value contained a
    // generator expression.
    if (out != *outdir) {
      conf.clear();
    }
  } else if (this->GetType() == cmStateEnums::EXECUTABLE) {
    // Lookup the output path for executables.
    out = this->Makefile->GetSafeDefinition("EXECUTABLE_OUTPUT_PATH");
  } else if (this->GetType() == cmStateEnums::STATIC_LIBRARY ||
             this->GetType() == cmStateEnums::SHARED_LIBRARY ||
             this->GetType() == cmStateEnums::MODULE_LIBRARY) {
    // Lookup the output path for libraries.
    out = this->Makefile->GetSafeDefinition("LIBRARY_OUTPUT_PATH");
  }
  if (out.empty()) {
    // Default to the current output directory.
    usesDefaultOutputDir = true;
    out = ".";
  }

  // Convert the output path to a full path in case it is
  // specified as a relative path.  Treat a relative path as
  // relative to the current output directory for this makefile.
  out = (cmSystemTools::CollapseFullPath(
    out, this->LocalGenerator->GetCurrentBinaryDirectory()));

  // The generator may add the configuration's subdirectory.
  if (!conf.empty()) {
    bool useEPN =
      this->GlobalGenerator->UseEffectivePlatformName(this->Makefile);
    std::string suffix =
      usesDefaultOutputDir && useEPN ? "${EFFECTIVE_PLATFORM_NAME}" : "";
    this->LocalGenerator->GetGlobalGenerator()->AppendDirectoryForConfig(
      "/", conf, suffix, out);
  }

  return usesDefaultOutputDir;
}